

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O3

void __thiscall QWidgetResizeHandler::doResize(QWidgetResizeHandler *this)

{
  QWidget *pQVar1;
  long lVar2;
  QPoint QVar3;
  undefined4 extraout_EDX;
  uint uVar4;
  MousePosition m;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)this[0x40] & 4) != 0) {
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] | 2);
    pQVar1 = *(QWidget **)(this + 0x10);
    local_28 = (QPoint)QCursor::pos();
    QVar3 = QWidget::mapFromGlobal(pQVar1,&local_28);
    *(QPoint *)(this + 0x20) = QVar3;
    lVar2 = *(long *)(*(long *)(this + 0x10) + 0x20);
    iVar6 = -(uint)(QVar3.xp.m_i.m_i <
                   (((int)*(undefined8 *)(lVar2 + 0x1c) - (int)*(undefined8 *)(lVar2 + 0x14)) + 1) /
                   2);
    iVar7 = -(uint)(QVar3.yp.m_i.m_i <
                   (((int)((ulong)*(undefined8 *)(lVar2 + 0x1c) >> 0x20) -
                    (int)((ulong)*(undefined8 *)(lVar2 + 0x14) >> 0x20)) + 1) / 2);
    auVar5._4_4_ = iVar6;
    auVar5._0_4_ = iVar6;
    auVar5._8_4_ = iVar7;
    auVar5._12_4_ = iVar7;
    uVar4 = movmskpd(extraout_EDX,auVar5);
    m = (uVar4 & 0xfffffffe) + BottomRight;
    if ((uVar4 & 1) != 0) {
      m = (uint)((uVar4 & 2) == 0) * 2 + TopLeft;
    }
    *(MousePosition *)(this + 0x30) = m;
    *(ulong *)(this + 0x28) =
         CONCAT44(*(int *)(lVar2 + 0x20) - (QVar3.yp.m_i.m_i + *(int *)(lVar2 + 0x18)),
                  *(int *)(lVar2 + 0x1c) - (*(int *)(lVar2 + 0x14) + QVar3.xp.m_i.m_i));
    setMouseCursor(this,m);
    pQVar1 = *(QWidget **)(this + 0x10);
    QWidget::cursor((QWidget *)&local_28);
    QWidget::grabMouse(pQVar1,(QCursor *)&local_28);
    QCursor::~QCursor((QCursor *)&local_28);
    QWidget::grabKeyboard(*(QWidget **)(this + 0x10));
    resizeHorizontalDirectionFixed = 0;
    resizeVerticalDirectionFixed = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetResizeHandler::doResize()
{
    if (!enabled)
        return;

    active = true;
    moveOffset = widget->mapFromGlobal(QCursor::pos());
    if (moveOffset.x() < widget->width()/2) {
        if (moveOffset.y() < widget->height()/2)
            mode = TopLeft;
        else
            mode = BottomLeft;
    } else {
        if (moveOffset.y() < widget->height()/2)
            mode = TopRight;
        else
            mode = BottomRight;
    }
    invertedMoveOffset = widget->rect().bottomRight() - moveOffset;
#ifndef QT_NO_CURSOR
    setMouseCursor(mode);
    widget->grabMouse(widget->cursor() );
#else
    widget->grabMouse();
#endif
    widget->grabKeyboard();
    resizeHorizontalDirectionFixed = false;
    resizeVerticalDirectionFixed = false;
}